

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool leveldb::FindLargestKey
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               InternalKey *largest_key)

{
  pointer ppFVar1;
  pointer ppFVar2;
  int iVar3;
  pointer ppFVar4;
  ulong uVar5;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  pointer local_40;
  size_type sStack_38;
  
  ppFVar1 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar1 != ppFVar2) {
    std::__cxx11::string::_M_assign((string *)largest_key);
    ppFVar4 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(files->
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4)) {
      uVar5 = 1;
      do {
        local_40 = (ppFVar4[uVar5]->largest).rep_._M_dataplus._M_p;
        sStack_38 = (ppFVar4[uVar5]->largest).rep_._M_string_length;
        local_50 = *(undefined4 *)&(largest_key->rep_)._M_dataplus._M_p;
        uStack_4c = *(undefined4 *)((long)&(largest_key->rep_)._M_dataplus._M_p + 4);
        uStack_48 = (undefined4)(largest_key->rep_)._M_string_length;
        uStack_44 = *(undefined4 *)((long)&(largest_key->rep_)._M_string_length + 4);
        iVar3 = (*(icmp->super_Comparator)._vptr_Comparator[2])(icmp,&local_40,&local_50);
        if (0 < iVar3) {
          std::__cxx11::string::_M_assign((string *)largest_key);
        }
        uVar5 = uVar5 + 1;
        ppFVar4 = (files->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(files->
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >>
                              3));
    }
  }
  return ppFVar1 != ppFVar2;
}

Assistant:

void VersionSet::MarkFileNumberUsed(uint64_t number) {
  if (next_file_number_ <= number) {
    next_file_number_ = number + 1;
  }
}